

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBJMeshFileLoader.h
# Opt level: O0

void __thiscall irr::scene::COBJMeshFileLoader::SObjMtl::SObjMtl(SObjMtl *this,SObjMtl *o)

{
  CMeshBuffer<irr::video::S3DVertex> *this_00;
  SMaterial *in_RSI;
  SMaterial *in_RDI;
  string<char> *in_stack_ffffffffffffffd8;
  string<char> *in_stack_ffffffffffffffe0;
  
  ::std::
  map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
  ::map((map<irr::video::S3DVertex,_int,_std::less<irr::video::S3DVertex>,_std::allocator<std::pair<const_irr::video::S3DVertex,_int>_>_>
         *)0x2db30d);
  core::string<char>::string(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  core::string<char>::string(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  *(undefined4 *)&in_RDI->TextureLayers[3].TextureMatrix =
       *(undefined4 *)&in_RSI->TextureLayers[3].TextureMatrix;
  *(undefined1 *)((long)&in_RDI->TextureLayers[3].TextureMatrix + 4) =
       *(undefined1 *)((long)&in_RSI->TextureLayers[3].TextureMatrix + 4);
  *(undefined1 *)((long)&in_RDI->TextureLayers[3].TextureMatrix + 5) = 0;
  this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
  CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(this_00);
  *(CMeshBuffer<irr::video::S3DVertex> **)&in_RDI->TextureLayers[1].MagFilter = this_00;
  video::SMaterial::operator=(in_RSI,in_RDI);
  return;
}

Assistant:

SObjMtl(const SObjMtl &o) :
				Name(o.Name), Group(o.Group),
				Bumpiness(o.Bumpiness), Illumination(o.Illumination),
				RecalculateNormals(false)
		{
			Meshbuffer = new SMeshBuffer();
			Meshbuffer->Material = o.Meshbuffer->Material;
		}